

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O1

void __thiscall mdsplit::mdsplitter::list_doc_outsiders(mdsplitter *this)

{
  mdsection *pmVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  path *ppVar8;
  size_t sVar9;
  istream *piVar10;
  ostream *poVar11;
  mdsection *pmVar12;
  mdsection *this_00;
  pointer ppVar13;
  byte bVar14;
  long lVar15;
  undefined1 auVar16 [16];
  string current_line;
  regex gen_with_mdsplit_regex;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> outsiders;
  regex ignore_begin_regex;
  regex ignore_end_regex;
  smatch sm;
  path outsider;
  path local_368;
  mdsplitter *local_338;
  path *local_330;
  string local_328;
  undefined1 local_308 [32];
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_2e8;
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2a0;
  ostream *local_288;
  path *local_280;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_278;
  recursive_directory_iterator local_258;
  recursive_directory_iterator local_248;
  path local_238 [13];
  
  local_2e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
  local_2e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
  local_2e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)local_308,&this->output_dir_,none,(error_code *)0x0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_308._8_8_ + 8) = *(_Atomic_word *)(local_308._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_308._8_8_ + 8) = *(_Atomic_word *)(local_308._8_8_ + 8) + 1;
    }
  }
  local_2c8._0_8_ = local_308._0_8_;
  local_2c8._8_8_ = local_308._8_8_;
  local_248._M_dirs._M_ptr = (element_type *)0x0;
  local_248._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_248);
  local_258._M_dirs._M_ptr = (element_type *)local_308._0_8_;
  local_258._M_dirs._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_308._8_8_ + 8) = *(_Atomic_word *)(local_308._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_308._8_8_ + 8) = *(_Atomic_word *)(local_308._8_8_ + 8) + 1;
    }
  }
  local_2a8 = (undefined1  [8])0x0;
  _Stack_2a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_338 = this;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_258);
  bVar4 = true;
  do {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_ == _Stack_2a0._M_pi) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)local_2a8);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)local_2c8);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)local_308);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_308,
                 " *<!-- Generated with mdsplit: https://github.com/alandefreitas/mdsplit --> *",
                 0x10);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2c8,
                 " *<!-- START mdsplit-ignore --> *",0x10);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2a8,
                 " *<!-- END mdsplit-ignore --> *",0x10);
      local_280 = local_2e8.
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_2e8.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2e8.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar13 = local_2e8.
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar2 = (ppVar13->_M_pathname)._M_dataplus._M_p;
          local_368._M_pathname._M_dataplus._M_p = (pointer)&local_368._M_pathname.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_368,pcVar2,pcVar2 + (ppVar13->_M_pathname)._M_string_length);
          std::ifstream::ifstream(local_238,(string *)&local_368,_S_in);
          local_330 = ppVar13;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_pathname._M_dataplus._M_p != &local_368._M_pathname.field_2) {
            operator_delete(local_368._M_pathname._M_dataplus._M_p,
                            local_368._M_pathname.field_2._M_allocated_capacity + 1);
          }
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          local_328._M_string_length = 0;
          local_328.field_2._M_local_buf[0] = '\0';
          bVar14 = 0;
          bVar4 = false;
          do {
            cVar6 = std::ios::widen((char)*(undefined8 *)
                                           (local_238[0]._M_pathname._M_dataplus._M_p + -0x18) +
                                    (char)local_238);
            piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_238,(string *)&local_328,cVar6);
            if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
            local_278.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_278._M_begin._M_current = (char *)0x0;
            local_278.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_278.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            bVar5 = is_codeblock(&local_328);
            bVar14 = bVar14 ^ bVar5;
            if (bVar14 == 0) {
              local_368._M_pathname.field_2._M_allocated_capacity = 0;
              local_368._M_pathname.field_2._8_8_ = 0;
              local_368._M_pathname._M_dataplus._M_p = (pointer)0x0;
              local_368._M_pathname._M_string_length = 0;
              bVar5 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_328._M_dataplus._M_p,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(local_328._M_dataplus._M_p + local_328._M_string_length),
                                 (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)&local_368,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2c8,0
                                );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_pathname._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_368._M_pathname._M_dataplus._M_p,
                                local_368._M_pathname.field_2._M_allocated_capacity -
                                (long)local_368._M_pathname._M_dataplus._M_p);
              }
              iVar7 = 6;
              if (bVar5) {
                bVar4 = true;
              }
              else {
                local_368._M_pathname.field_2._M_allocated_capacity = 0;
                local_368._M_pathname.field_2._8_8_ = 0;
                local_368._M_pathname._M_dataplus._M_p = (pointer)0x0;
                local_368._M_pathname._M_string_length = 0;
                bVar5 = std::__detail::
                        __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_328._M_dataplus._M_p,
                                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(local_328._M_dataplus._M_p + local_328._M_string_length),
                                   (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)&local_368,
                                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2a8
                                   ,0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_pathname._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_368._M_pathname._M_dataplus._M_p,
                                  local_368._M_pathname.field_2._M_allocated_capacity -
                                  (long)local_368._M_pathname._M_dataplus._M_p);
                }
                if (bVar5) {
                  bVar4 = false;
                }
                else if (!bVar4) {
                  bVar5 = std::__detail::
                          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_328._M_dataplus._M_p,
                                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(local_328._M_dataplus._M_p + local_328._M_string_length),
                                     &local_278,
                                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     local_308,0);
                  iVar7 = 0;
                  if (bVar5) {
                    if (local_338->trace_ == true) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Outsider doc file generated by mdsplit: ",
                                 0x28);
                      pcVar2 = (local_330->_M_pathname)._M_dataplus._M_p;
                      local_368._M_pathname._M_dataplus._M_p =
                           (pointer)&local_368._M_pathname.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_368,pcVar2,
                                 pcVar2 + (local_330->_M_pathname)._M_string_length);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           local_368._M_pathname._M_dataplus._M_p,
                                           local_368._M_pathname._M_string_length);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) +
                                      (char)poVar11);
                      std::ostream::put((char)poVar11);
                      std::ostream::flush();
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_pathname._M_dataplus._M_p !=
                          &local_368._M_pathname.field_2) {
                        operator_delete(local_368._M_pathname._M_dataplus._M_p,
                                        local_368._M_pathname.field_2._M_allocated_capacity + 1);
                      }
                    }
                    iVar7 = 7;
                    if (local_338->erase_old_mdsplit_files_ == true) {
                      if (local_338->trace_ == true) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"Removing ",9);
                        pcVar2 = (local_330->_M_pathname)._M_dataplus._M_p;
                        local_368._M_pathname._M_dataplus._M_p =
                             (pointer)&local_368._M_pathname.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_368,pcVar2,
                                   pcVar2 + (local_330->_M_pathname)._M_string_length);
                        local_288 = std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               local_368._M_pathname._M_dataplus._M_p,
                                               local_368._M_pathname._M_string_length);
                        std::ios::widen((char)*(undefined8 *)(*(long *)local_288 + -0x18) +
                                        (char)local_288);
                        std::ostream::put((char)local_288);
                        std::ostream::flush();
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_368._M_pathname._M_dataplus._M_p !=
                            &local_368._M_pathname.field_2) {
                          operator_delete(local_368._M_pathname._M_dataplus._M_p,
                                          local_368._M_pathname.field_2._M_allocated_capacity + 1);
                        }
                      }
                      std::filesystem::remove(local_330);
                    }
                  }
                  if (!bVar5) goto LAB_001294ef;
                }
              }
            }
            else {
LAB_001294ef:
              iVar7 = 0;
            }
            if (local_278.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_278.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_278.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_278.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          } while (iVar7 != 7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,
                            CONCAT71(local_328.field_2._M_allocated_capacity._1_7_,
                                     local_328.field_2._M_local_buf[0]) + 1);
          }
          std::ifstream::~ifstream(local_238);
          ppVar13 = local_330 + 1;
        } while (ppVar13 != local_280);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2a8);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2c8);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_308);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      ~vector(&local_2e8);
      return;
    }
    ppVar8 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                               ((recursive_directory_iterator *)local_2c8);
    auVar16 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar16._8_8_ == -1 || auVar16._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(local_238);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_368,auVar16._0_8_);
      std::filesystem::__cxx11::path::path(local_238,&local_368._M_pathname,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_pathname._M_dataplus._M_p != &local_368._M_pathname.field_2) {
        operator_delete(local_368._M_pathname._M_dataplus._M_p,
                        local_368._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
              (&local_368,(char (*) [4])0x12e238,auto_format);
    iVar7 = std::filesystem::__cxx11::path::compare(local_238);
    std::filesystem::__cxx11::path::~path(&local_368);
    std::filesystem::__cxx11::path::~path(local_238);
    if (iVar7 == 0) {
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative(local_238,ppVar8);
      std::filesystem::__cxx11::path::~path(&local_368);
      pmVar12 = (local_338->sections_).
                super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
                super__Vector_impl_data._M_start;
      pmVar1 = (local_338->sections_).
               super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar15 = (long)pmVar1 - (long)pmVar12 >> 9;
      if (0 < lVar15) {
        lVar15 = lVar15 + 1;
        do {
          iVar7 = std::filesystem::__cxx11::path::compare(&pmVar12->filepath);
          this_00 = pmVar12;
          if (iVar7 == 0) goto LAB_00129200;
          iVar7 = std::filesystem::__cxx11::path::compare(&pmVar12[1].filepath);
          if (iVar7 == 0) {
            this_00 = pmVar12 + 1;
            goto LAB_00129200;
          }
          iVar7 = std::filesystem::__cxx11::path::compare(&pmVar12[2].filepath);
          if (iVar7 == 0) {
            this_00 = pmVar12 + 2;
            goto LAB_00129200;
          }
          iVar7 = std::filesystem::__cxx11::path::compare(&pmVar12[3].filepath);
          if (iVar7 == 0) {
            this_00 = pmVar12 + 3;
            goto LAB_00129200;
          }
          pmVar12 = pmVar12 + 4;
          lVar15 = lVar15 + -1;
        } while (1 < lVar15);
      }
      lVar15 = (long)pmVar1 - (long)pmVar12 >> 7;
      if (lVar15 == 1) {
LAB_001291d1:
        iVar7 = std::filesystem::__cxx11::path::compare(&pmVar12->filepath);
        this_00 = pmVar12;
        if (iVar7 != 0) {
          this_00 = pmVar1;
        }
      }
      else if (lVar15 == 2) {
LAB_001291bd:
        iVar7 = std::filesystem::__cxx11::path::compare(&pmVar12->filepath);
        this_00 = pmVar12;
        if (iVar7 != 0) {
          pmVar12 = pmVar12 + 1;
          goto LAB_001291d1;
        }
      }
      else {
        this_00 = pmVar1;
        if ((lVar15 == 3) &&
           (iVar7 = std::filesystem::__cxx11::path::compare(&pmVar12->filepath), this_00 = pmVar12,
           iVar7 != 0)) {
          pmVar12 = pmVar12 + 1;
          goto LAB_001291bd;
        }
      }
LAB_00129200:
      if ((this_00 ==
           (local_338->sections_).
           super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (bVar5 = mdsection::has_content(this_00,false,false), !bVar5)) {
        if (bVar4) {
          if (local_338->trace_ == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "\n# The following .md files were not generated by mdsplit in this run",0x44)
            ;
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
            std::ostream::put(-0x50);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# Please make sure that is on purpose:",0x26);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
            std::ostream::put(-0x50);
            std::ostream::flush();
          }
          bVar4 = false;
        }
        if (local_338->trace_ == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Outsider doc file: ",0x13);
          _Var3._M_p = local_238[0]._M_pathname._M_dataplus._M_p;
          if (local_238[0]._M_pathname._M_dataplus._M_p == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1412b0);
          }
          else {
            sVar9 = strlen(local_238[0]._M_pathname._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,_Var3._M_p,sVar9);
          }
          local_368._M_pathname._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)&local_368,1);
        }
        std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
        emplace_back<std::filesystem::__cxx11::path&>
                  ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                    *)&local_2e8,local_238);
      }
      std::filesystem::__cxx11::path::~path(local_238);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_2c8);
  } while( true );
}

Assistant:

void mdsplitter::list_doc_outsiders() {
        bool first = true;
        std::vector<fs::path> outsiders;
        for (auto &p : fs::recursive_directory_iterator(output_dir_)) {
            if (p.path().extension() == ".md") {
                fs::path outsider = fs::relative(p.path(), fs::current_path());
                auto it = std::find_if(
                    sections_.begin(), sections_.end(),
                    [&](const mdsection &s) { return s.filepath == outsider; });
                bool section_exists = it != sections_.end();
                if (!section_exists || !it->has_content()) {
                    if (first) {
                        if (trace_) {
                            std::cout << "\n# The following .md files were not "
                                         "generated by mdsplit in this run"
                                      << std::endl;
                            std::cout
                                << "# Please make sure that is on purpose:"
                                << std::endl;
                        }
                        first = false;
                    }
                    if (trace_) {
                        std::cout << "Outsider doc file: " << outsider.c_str()
                                  << '\n';
                    }
                    outsiders.emplace_back(outsider);
                }
            }
        }

        // Remove outsiders generated by mdsplit
        std::regex gen_with_mdsplit_regex{
            R"( *<!-- Generated with mdsplit: https://github.com/alandefreitas/mdsplit --> *)"};
        std::regex ignore_begin_regex{R"( *<!-- START mdsplit-ignore --> *)"};
        std::regex ignore_end_regex{R"( *<!-- END mdsplit-ignore --> *)"};

        for (const auto &outsider : outsiders) {
            std::ifstream fin(outsider.string());
            std::string current_line;
            bool inside_codeblock = false;
            bool inside_ignoreblock = false;
            while (std::getline(fin, current_line)) {
                std::smatch sm;
                if (is_codeblock(current_line)) {
                    inside_codeblock = 1 - inside_codeblock;
                }
                if (!inside_codeblock) {
                    if (std::regex_match(current_line, ignore_begin_regex)) {
                        inside_ignoreblock = true;
                        continue;
                    } else if (std::regex_match(current_line,
                                                ignore_end_regex)) {
                        inside_ignoreblock = false;
                        continue;
                    }
                    if (inside_ignoreblock) {
                        continue;
                    }

                    bool is_mdsplit_file = std::regex_search(
                        current_line, sm, gen_with_mdsplit_regex);
                    if (is_mdsplit_file) {
                        if (trace_) {
                            std::cout
                                << "Outsider doc file generated by mdsplit: "
                                << outsider.string() << std::endl;
                        }
                        if (erase_old_mdsplit_files_) {
                            if (trace_) {
                                std::cout << "Removing " << outsider.string()
                                          << std::endl;
                            }
                            fs::remove(outsider);
                        }
                        break;
                    }
                }
            }
        }
    }